

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printJointPolicyPureVector.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  DecPOMDPDiscreteInterface *pDVar1;
  NullPlanner *this;
  ulong uVar2;
  ostream *poVar3;
  JointPolicyPureVector jp;
  Arguments args;
  JointPolicyPureVector local_2f0 [56];
  undefined1 local_2b8 [96];
  undefined1 local_258 [568];
  
  ArgumentHandlers::Arguments::Arguments((Arguments *)local_258);
  argp_parse(ArgumentHandlers::theArgpStruc,argc,argv,0,0,local_258);
  pDVar1 = (DecPOMDPDiscreteInterface *)
           ArgumentUtils::GetDecPOMDPDiscreteInterfaceFromArgs((Arguments *)local_258);
  this = (NullPlanner *)operator_new(0x338);
  NullPlanner::NullPlanner
            (this,(long)(int)local_258._120_4_,pDVar1,(PlanningUnitMADPDiscreteParameters *)0x0);
  JointPolicyPureVector::JointPolicyPureVector
            (local_2f0,(Interface_ProblemToPolicyDiscretePure *)(this + 0x28));
  uVar2 = PlanningUnitMADPDiscrete::GetNrJointPolicies();
  if ((ulong)local_258._136_8_ < uVar2) {
    JPolComponent_VectorImplementation::SetIndex((ulonglong)local_2b8);
    JointPolicy::Print((JointPolicy *)local_2f0);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"Error: index ");
    poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar3);
    poVar3 = std::operator<<(poVar3," is too high, there are only ");
    PlanningUnitMADPDiscrete::GetNrJointPolicies();
    poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar3);
    poVar3 = std::operator<<(poVar3," joint policies.");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  JointPolicyPureVector::~JointPolicyPureVector(local_2f0);
  std::__cxx11::string::~string((string *)(local_258 + 0x1e8));
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    try {

    ArgumentHandlers::Arguments args;
    argp_parse (&ArgumentHandlers::theArgpStruc, argc, argv, 0, 0, &args);

    DecPOMDPDiscreteInterface *dpomdp=GetDecPOMDPDiscreteInterfaceFromArgs(args);
    LIndex index=args.jpolIndex;
    NullPlanner *np=new NullPlanner(args.horizon,dpomdp);
    JointPolicyPureVector jp(np);

    if(index>=np->GetNrJointPolicies())
    {
        cout << "Error: index " << index << " is too high, there are only "
             << np->GetNrJointPolicies() << " joint policies." << endl;
        return(0);
    }
    jp.SetIndex(index);

    jp.Print();
    }
    catch(E& e){ e.Print(); }

    return(0);
}